

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<Complex>::inverseExt(Matrix<Complex> *this,Matrix<Complex> *ext)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  int *in_RSI;
  int *in_RDI;
  Matrix<Complex> *in_stack_00000090;
  Matrix<Complex> *in_stack_00000098;
  uint q;
  uint j_2;
  uint j_1;
  uint j;
  Complex coeff;
  uint i;
  Complex *in_stack_fffffffffffffcd8;
  row_t in_stack_fffffffffffffce0;
  Complex *in_stack_fffffffffffffce8;
  row_t in_stack_fffffffffffffcf0;
  row_t in_stack_fffffffffffffd80;
  Complex *in_stack_fffffffffffffd88;
  MatrixRow<Complex_&> local_1f8;
  MatrixRow<Complex_&> local_1f0;
  MatrixRow<Complex_&> local_1e8 [10];
  Complex *in_stack_fffffffffffffe68;
  Complex *in_stack_fffffffffffffe70;
  uint local_15c;
  MatrixRow<Complex_&> local_158;
  uint local_14c;
  MatrixRow<Complex_&> local_148;
  uint local_13c;
  MatrixRow<Complex_&> local_138;
  uint local_12c;
  MatrixRow<Complex_&> local_128 [33];
  uint local_20;
  int *local_10;
  
  if (in_RDI[1] != *in_RDI) {
    uVar3 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffce0.arr,(char *)in_stack_fffffffffffffcd8);
    __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  if (*in_RDI == *in_RSI) {
    local_10 = in_RSI;
    uVar2 = gauss(in_stack_00000098,in_stack_00000090);
    if (uVar2 == in_RDI[1]) {
      local_20 = in_RDI[1];
      while (local_20 = local_20 - 1, local_20 != 0xffffffff) {
        Complex::Complex(in_stack_fffffffffffffcf0.arr,(longlong)in_stack_fffffffffffffce8);
        local_128[0].arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
        MatrixRow<Complex_&>::operator[](local_128,local_20);
        ::operator/(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80.arr);
        Complex::~Complex(in_stack_fffffffffffffce0.arr);
        for (local_12c = 0; local_12c < (uint)in_RDI[1]; local_12c = local_12c + 1) {
          local_138.arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
          MatrixRow<Complex_&>::operator[](&local_138,local_12c);
          Complex::operator*=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        }
        for (local_13c = 0; uVar2 = local_20, local_13c < (uint)local_10[1];
            local_13c = local_13c + 1) {
          local_148.arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
          MatrixRow<Complex_&>::operator[](&local_148,local_13c);
          Complex::operator*=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        }
        while (local_14c = uVar2 + 1, local_14c < (uint)in_RDI[1]) {
          local_158.arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
          MatrixRow<Complex_&>::operator[](&local_158,local_14c);
          bVar1 = Complex::operator_cast_to_bool(in_stack_fffffffffffffce0.arr);
          uVar2 = local_14c;
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            for (local_15c = 0; local_15c < (uint)local_10[1]; local_15c = local_15c + 1) {
              local_1e8[0].arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
              MatrixRow<Complex_&>::operator[](local_1e8,local_15c);
              local_1f0.arr = (Complex *)operator[](in_stack_fffffffffffffcd8,0);
              MatrixRow<Complex_&>::operator[](&local_1f0,local_14c);
              ::operator*(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80.arr);
              in_stack_fffffffffffffcf0 = operator[](in_stack_fffffffffffffcd8,0);
              local_1f8.arr = in_stack_fffffffffffffcf0.arr;
              in_stack_fffffffffffffce8 = MatrixRow<Complex_&>::operator[](&local_1f8,local_15c);
              Complex::operator-=(in_stack_fffffffffffffce0.arr,in_stack_fffffffffffffcd8);
              Complex::~Complex(in_stack_fffffffffffffce0.arr);
            }
            Complex::Complex(in_stack_fffffffffffffcf0.arr);
            in_stack_fffffffffffffce0 = operator[](in_stack_fffffffffffffcd8,0);
            in_stack_fffffffffffffd80 = in_stack_fffffffffffffce0;
            in_stack_fffffffffffffcd8 =
                 MatrixRow<Complex_&>::operator[]
                           ((MatrixRow<Complex_&> *)&stack0xfffffffffffffd80,local_14c);
            Complex::operator=(in_stack_fffffffffffffce0.arr,in_stack_fffffffffffffcd8);
            Complex::~Complex(in_stack_fffffffffffffce0.arr);
            uVar2 = local_14c;
          }
        }
        Complex::~Complex(in_stack_fffffffffffffce0.arr);
      }
      return;
    }
    uVar3 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffce0.arr,(char *)in_stack_fffffffffffffcd8);
    __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  uVar3 = __cxa_allocate_exception(0x10);
  matrix_error::runtime_error
            ((matrix_error *)in_stack_fffffffffffffce0.arr,(char *)in_stack_fffffffffffffcd8);
  __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}